

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

void __thiscall ftxui::ComponentBase::Detach(ComponentBase *this)

{
  ComponentBase *pCVar1;
  shared_ptr<ftxui::ComponentBase> *psVar2;
  shared_ptr<ftxui::ComponentBase> *psVar3;
  long lVar4;
  long lVar5;
  const_iterator __position;
  
  pCVar1 = this->parent_;
  if (pCVar1 == (ComponentBase *)0x0) {
    return;
  }
  psVar3 = (pCVar1->children_).
           super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (pCVar1->children_).
           super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)psVar2 - (long)psVar3;
  for (lVar5 = lVar4 >> 6; 0 < lVar5; lVar5 = lVar5 + -1) {
    __position._M_current = psVar3;
    if ((psVar3->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        this) goto LAB_0012fc35;
    if (psVar3[1].super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        this) {
      __position._M_current = psVar3 + 1;
      goto LAB_0012fc35;
    }
    if (psVar3[2].super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        this) {
      __position._M_current = psVar3 + 2;
      goto LAB_0012fc35;
    }
    if (psVar3[3].super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        this) {
      __position._M_current = psVar3 + 3;
      goto LAB_0012fc35;
    }
    psVar3 = psVar3 + 4;
    lVar4 = lVar4 + -0x40;
  }
  lVar4 = lVar4 >> 4;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      __position._M_current = psVar2;
      if ((lVar4 != 3) ||
         (__position._M_current = psVar3,
         (psVar3->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
         this)) goto LAB_0012fc35;
      psVar3 = psVar3 + 1;
    }
    __position._M_current = psVar3;
    if ((psVar3->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        this) goto LAB_0012fc35;
    psVar3 = psVar3 + 1;
  }
  __position._M_current = psVar2;
  if ((psVar3->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == this)
  {
    __position._M_current = psVar3;
  }
LAB_0012fc35:
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::erase(&pCVar1->children_,__position);
  this->parent_ = (ComponentBase *)0x0;
  return;
}

Assistant:

void ComponentBase::Detach() {
  if (!parent_)
    return;
  auto it = std::find_if(std::begin(parent_->children_),  //
                         std::end(parent_->children_),    //
                         [this](const Component& that) {  //
                           return this == that.get();
                         });
  parent_->children_.erase(it);
  parent_ = nullptr;
}